

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_io.cc
# Opt level: O2

void __thiscall gimage::RAWImageIO::save(RAWImageIO *this,ImageU8 *image,char *name)

{
  int iVar1;
  IOException *this_00;
  long i;
  long lVar2;
  long k;
  long lVar3;
  allocator local_269;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  ofstream out;
  undefined1 local_220 [24];
  int aiStack_208 [120];
  
  iVar1 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name,0);
  if (((char)iVar1 != '\0') && (image->depth == 1)) {
    anon_unknown_8::writeRAWHeader(name,1,image->width,image->height);
    std::ofstream::ofstream(&out);
    std::ios::exceptions((int)&out + (int)*(undefined8 *)(_out + -0x18));
    std::ofstream::open((char *)&out,(_Ios_Openmode)name);
    lVar3 = 0;
    while ((lVar3 < image->height && (*(int *)((long)aiStack_208 + *(long *)(_out + -0x18)) == 0)))
    {
      for (lVar2 = 0; lVar2 < image->width; lVar2 = lVar2 + 1) {
        std::streambuf::sputc((char)local_220);
      }
      lVar3 = lVar3 + 1;
    }
    std::ofstream::close();
    std::ofstream::~ofstream(&out);
    return;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_248,name,&local_269);
  std::operator+(&local_268,"Can only save RAW images with depth 1 (",&local_248);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out,
                 &local_268,")");
  gutil::IOException::IOException(this_00,(string *)&out);
  __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

void RAWImageIO::save(const ImageU8 &image, const char *name) const
{
  if (!handlesFile(name, false) || image.getDepth() != 1)
  {
    throw gutil::IOException("Can only save RAW images with depth 1 ("+std::string(name)+")");
  }

  writeRAWHeader(name, 1, image.getWidth(), image.getHeight());

  try
  {
    std::ofstream out;
    out.exceptions(std::ios_base::failbit | std::ios_base::badbit);
    out.open(name, std::ios::binary);

    std::streambuf *sb=out.rdbuf();

    for (long k=0; k<image.getHeight() && out.good(); k++)
    {
      for (long i=0; i<image.getWidth(); i++)
      {
        sb->sputc(static_cast<char>(image.get(i, k)));
      }
    }

    out.close();
  }
  catch (const std::ios_base::failure &ex)
  {
    throw gutil::IOException(ex.what());
  }
}